

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_get_target(ATTACH_HANDLE attach,AMQP_VALUE *target_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  ATTACH_INSTANCE *attach_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *target_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x11bc;
  }
  else {
    _item_count = target_value;
    target_value_local = &attach->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,(uint32_t *)&attach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)attach_instance < 7) {
        attach_instance._4_4_ = 0x11ca;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(attach->composite_value,6);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          attach_instance._4_4_ = 0x11d2;
        }
        else {
          *_item_count = value;
          attach_instance._4_4_ = 0;
        }
      }
    }
    else {
      attach_instance._4_4_ = 0x11c4;
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_get_target(ATTACH_HANDLE attach, AMQP_VALUE* target_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 6)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 6);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *target_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}